

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O1

CURLcode Curl_altsvc_parse(Curl_easy *data,altsvcinfo *asi,char *value,alpnid srcalpnid,
                          char *srchost,unsigned_short srcport)

{
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  byte bVar3;
  unsigned_short uVar4;
  int iVar5;
  alpnid dstalpnid;
  size_t dlen;
  unsigned_long ulnum;
  altsvc *p;
  time_t tVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  bool bVar10;
  _Bool _Var11;
  ulong uVar12;
  bool bVar13;
  ulong uVar14;
  byte *pbVar15;
  int iVar16;
  char alpnbuf [10];
  char *end_ptr;
  char option [32];
  uint local_bc;
  long local_b0;
  undefined4 local_a4;
  char local_a0 [16];
  ulong local_90;
  byte *local_88;
  byte *local_80;
  size_t local_78;
  Curl_easy *local_70;
  altsvcinfo *local_68;
  Curl_llist *local_60;
  char local_58 [40];
  
  local_a0[8] = '\0';
  local_a0[9] = '\0';
  local_a0[0] = '\0';
  local_a0[1] = '\0';
  local_a0[2] = '\0';
  local_a0[3] = '\0';
  local_a0[4] = '\0';
  local_a0[5] = '\0';
  local_a0[6] = '\0';
  local_a0[7] = '\0';
  for (; (*value == '\t' || (*value == ' ')); value = value + 1) {
  }
  local_bc = (uint)srcport;
  uVar14 = 0;
  while ((0x3d < (ulong)(byte)value[uVar14] ||
         ((0x2800000100000201U >> ((ulong)(byte)value[uVar14] & 0x3f) & 1) == 0))) {
    uVar14 = uVar14 + 1;
  }
  local_88 = (byte *)srchost;
  if (uVar14 < 10 && uVar14 != 0) {
    memcpy(local_a0,value,uVar14);
    local_a0[uVar14] = '\0';
    iVar5 = curl_strequal(local_a0,"clear");
    if (iVar5 == 0) {
      pbVar7 = (byte *)(value + uVar14);
      local_60 = &asi->list;
      local_b0 = 0;
      local_a4 = local_bc;
      local_68 = asi;
      while (*pbVar7 == 0x3d) {
        dstalpnid = alpn2alpnid(local_a0);
        pbVar9 = local_88;
        if (pbVar7[1] == 0x22) {
          pbVar8 = pbVar7 + 2;
          if (pbVar7[2] == 0x3a) {
            dlen = strlen((char *)local_88);
            bVar13 = true;
            goto LAB_001110af;
          }
          if (pbVar7[2] == 0x5b) {
            dlen = strspn((char *)(pbVar7 + 3),"0123456789abcdefABCDEF:.");
            if (pbVar7[dlen + 3] == 0x5d) {
              pbVar7 = pbVar7 + dlen + 4;
              dlen = dlen + 2;
              goto LAB_0011102b;
            }
            bVar13 = true;
            iVar5 = 6;
            bVar10 = false;
            pbVar8 = (byte *)0x1818de;
            pbVar7 = pbVar7 + 3;
          }
          else {
            bVar3 = *pbVar8;
            pbVar7 = pbVar8;
            while ((bVar3 != 0 &&
                   (((byte)(bVar3 + 0x9f) < 0x1a || (byte)(bVar3 - 0x30) < 10 ||
                    ((byte)(bVar3 + 0xbf) < 0x1a || (byte)(bVar3 - 0x2d) < 2))))) {
              pbVar9 = pbVar7 + 1;
              pbVar7 = pbVar7 + 1;
              bVar3 = *pbVar9;
            }
            dlen = (long)pbVar7 - (long)pbVar8;
LAB_0011102b:
            bVar10 = true;
            if (dlen - 0x200 < 0xfffffffffffffe01) {
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar1->log_level)))) {
                Curl_infof(data,"Excessive alt-svc hostname, ignoring.");
              }
              iVar5 = 0;
              pbVar8 = (byte *)0x1818de;
              bVar13 = false;
            }
            else {
              iVar5 = 0;
              bVar13 = true;
            }
          }
          pbVar9 = pbVar8;
          pbVar8 = pbVar7;
          if (bVar10) {
LAB_001110af:
            pbVar15 = pbVar8;
            if (*pbVar8 == 0x3a) {
              pbVar15 = pbVar8 + 1;
              if ((byte)(pbVar8[1] - 0x30) < 10) {
                ulnum = strtoul((char *)pbVar15,(char **)&local_80,10);
              }
              else {
                ulnum = 0;
                local_80 = pbVar15;
              }
              pbVar7 = local_80;
              if (((ulnum - 0x10000 < 0xffffffffffff0001) || (local_80 == pbVar15)) ||
                 (*local_80 != 0x22)) {
                if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
                   ((pcVar1 = (data->state).feat, pcVar1 != (curl_trc_feat *)0x0 &&
                    (pcVar1->log_level < 1)))) {
                  bVar13 = false;
                }
                else {
                  Curl_infof(data,"Unknown alt-svc port number, ignoring.");
                  bVar13 = false;
                }
              }
              else {
                uVar4 = curlx_ultous(ulnum);
                local_bc = (uint)uVar4;
                pbVar15 = pbVar7;
              }
            }
            pbVar7 = pbVar15 + 1;
            iVar16 = 1;
            iVar5 = iVar16;
            if (*pbVar15 == 0x22) {
              bVar10 = false;
              uVar14 = 0x15180;
              local_70 = data;
              _Var2 = false;
LAB_00111197:
              _Var11 = _Var2;
              data = local_70;
              pbVar8 = pbVar7 + 2;
              while( true ) {
                pbVar15 = pbVar7 + 1;
                bVar3 = *pbVar7;
                if ((bVar3 != 9) && (bVar3 != 0x20)) break;
                pbVar8 = pbVar8 + 1;
                pbVar7 = pbVar15;
              }
              if ((bVar3 == 0x3b) &&
                 ((0xd < *pbVar15 || (pbVar7 = pbVar15, (0x2401U >> (*pbVar15 & 0x1f) & 1) == 0))))
              {
                for (; (*pbVar15 == 9 || (*pbVar15 == 0x20)); pbVar15 = pbVar15 + 1) {
                  pbVar8 = pbVar8 + 1;
                }
                uVar12 = 0;
                while ((0x3d < (ulong)pbVar15[uVar12] ||
                       ((0x2800000100000201U >> ((ulong)pbVar15[uVar12] & 0x3f) & 1) == 0))) {
                  uVar12 = uVar12 + 1;
                  pbVar8 = pbVar8 + 1;
                }
                local_78 = dlen;
                if (uVar12 < 0x20 && uVar12 != 0) {
                  local_90 = uVar14;
                  memcpy(local_58,pbVar15,uVar12);
                  local_58[uVar12] = '\0';
                }
                else {
                  local_58[0] = '\0';
                  local_90 = uVar14;
                }
                for (pbVar7 = pbVar15 + uVar12; (bVar3 = *pbVar7, bVar3 == 9 || (bVar3 == 0x20));
                    pbVar7 = pbVar7 + 1) {
                  pbVar8 = pbVar8 + 1;
                }
                data = local_70;
                iVar5 = iVar16;
                if (bVar3 == 0x3d) {
                  do {
                    pbVar7 = pbVar8;
                    bVar3 = *pbVar7;
                    pbVar8 = pbVar7;
                    if (bVar3 < 0x20) {
                      if (bVar3 != 9) goto LAB_001112ab;
                    }
                    else if (bVar3 != 0x20) {
                      if (bVar3 == 0x22) {
                        bVar10 = true;
                        pbVar8 = pbVar7 + 1;
                      }
                      goto LAB_001112c0;
                    }
                    pbVar8 = pbVar7 + 1;
                  } while( true );
                }
              }
              else {
                iVar5 = 0;
                if ((dstalpnid != ALPN_none) && (bVar13)) {
                  local_90 = uVar14;
                  if (local_b0 == 0) {
                    altsvc_flush(local_68,srcalpnid,(char *)local_88,(unsigned_short)local_a4);
                  }
                  local_b0 = local_b0 + 1;
                  p = altsvc_createid((char *)local_88,(char *)pbVar9,dlen,srcalpnid,dstalpnid,
                                      local_a4,local_bc);
                  if (p != (altsvc *)0x0) {
                    iVar5 = 0;
                    tVar6 = time((time_t *)0x0);
                    p->expires = tVar6 + local_90;
                    p->persist = _Var11;
                    Curl_llist_append(local_60,p,&p->node);
                    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                       ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar1->log_level)))) {
                      Curl_infof(data,"Added alt-svc: %s:%d over %s",pbVar9,(ulong)local_bc);
                      iVar5 = 0;
                    }
                  }
                }
              }
            }
          }
LAB_001113d4:
          if (iVar5 == 0) {
            bVar13 = true;
            if (*pbVar7 == 0x2c) {
              do {
                do {
                  pbVar9 = pbVar7;
                  pbVar8 = pbVar9 + 1;
                  pbVar7 = pbVar8;
                } while (pbVar9[1] == 9);
              } while (pbVar9[1] == 0x20);
              uVar14 = 1;
              while ((0x3d < (ulong)pbVar9[uVar14] ||
                     ((0x2800000100000201U >> ((ulong)pbVar9[uVar14] & 0x3f) & 1) == 0))) {
                uVar14 = uVar14 + 1;
              }
              pbVar7 = pbVar9 + uVar14;
              bVar13 = uVar14 < 0xb && uVar14 != 1;
              if (uVar14 < 0xb && uVar14 != 1) {
                memcpy(local_a0,pbVar8,uVar14 - 1);
                *(undefined1 *)((long)&local_a4 + uVar14 + 3) = 0;
              }
            }
          }
          else {
            bVar13 = false;
          }
        }
        else {
          pbVar7 = pbVar7 + 1;
          bVar13 = false;
        }
        if (!bVar13) {
          return CURLE_OK;
        }
        if (((ulong)*pbVar7 < 0x3c) && ((0x800000000002401U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0)) {
          return CURLE_OK;
        }
      }
    }
    else {
      altsvc_flush(asi,srcalpnid,(char *)local_88,srcport);
    }
  }
  else if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))
          ) {
    Curl_infof(data,"Excessive alt-svc header, ignoring.");
  }
  return CURLE_OK;
LAB_001112ab:
  iVar5 = 1;
  if (bVar3 == 0) goto LAB_001113d4;
LAB_001112c0:
  pbVar7 = pbVar8;
  pbVar15 = pbVar8;
  if (bVar10) {
    do {
      pbVar7 = pbVar15 + 1;
      bVar3 = *pbVar15;
      if (bVar3 == 0) break;
      pbVar15 = pbVar7;
    } while (bVar3 != 0x22);
    iVar5 = iVar16;
    if (bVar3 == 0) goto LAB_001113d4;
  }
  else {
    while ((0x3b < (ulong)*pbVar7 || ((0x800100100000201U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0))) {
      pbVar7 = pbVar7 + 1;
    }
  }
  uVar12 = strtoul((char *)pbVar8,(char **)&local_80,10);
  dlen = local_78;
  uVar14 = local_90;
  _Var2 = _Var11;
  if (uVar12 != 0xffffffffffffffff && local_80 != pbVar8) {
    iVar5 = curl_strequal("ma",local_58);
    dlen = local_78;
    uVar14 = uVar12;
    if (iVar5 == 0) {
      iVar5 = curl_strequal("persist",local_58);
      if (uVar12 == 1) {
        _Var2 = true;
      }
      dlen = local_78;
      uVar14 = local_90;
      if (iVar5 == 0) {
        _Var2 = _Var11;
      }
    }
  }
  goto LAB_00111197;
}

Assistant:

CURLcode Curl_altsvc_parse(struct Curl_easy *data,
                           struct altsvcinfo *asi, const char *value,
                           enum alpnid srcalpnid, const char *srchost,
                           unsigned short srcport)
{
  const char *p = value;
  char alpnbuf[MAX_ALTSVC_ALPNLEN] = "";
  struct altsvc *as;
  unsigned short dstport = srcport; /* the same by default */
  CURLcode result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
  size_t entries = 0;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif
  if(result) {
    infof(data, "Excessive alt-svc header, ignoring.");
    return CURLE_OK;
  }

  DEBUGASSERT(asi);

  /* "clear" is a magic keyword */
  if(strcasecompare(alpnbuf, "clear")) {
    /* Flush cached alternatives for this source origin */
    altsvc_flush(asi, srcalpnid, srchost, srcport);
    return CURLE_OK;
  }

  do {
    if(*p == '=') {
      /* [protocol]="[host][:port]" */
      enum alpnid dstalpnid = alpn2alpnid(alpnbuf); /* the same by default */
      p++;
      if(*p == '\"') {
        const char *dsthost = "";
        size_t dstlen = 0; /* destination hostname length */
        const char *value_ptr;
        char option[32];
        unsigned long num;
        char *end_ptr;
        bool quoted = FALSE;
        time_t maxage = 24 * 3600; /* default is 24 hours */
        bool persist = FALSE;
        bool valid = TRUE;
        p++;
        if(*p != ':') {
          /* hostname starts here */
          const char *hostp = p;
          if(*p == '[') {
            /* pass all valid IPv6 letters - does not handle zone id */
            dstlen = strspn(++p, "0123456789abcdefABCDEF:.");
            if(p[dstlen] != ']')
              /* invalid host syntax, bail out */
              break;
            /* we store the IPv6 numerical address *with* brackets */
            dstlen += 2;
            p = &p[dstlen-1];
          }
          else {
            while(*p && (ISALNUM(*p) || (*p == '.') || (*p == '-')))
              p++;
            dstlen = p - hostp;
          }
          if(!dstlen || (dstlen >= MAX_ALTSVC_HOSTLEN)) {
            infof(data, "Excessive alt-svc hostname, ignoring.");
            valid = FALSE;
          }
          else {
            dsthost = hostp;
          }
        }
        else {
          /* no destination name, use source host */
          dsthost = srchost;
          dstlen = strlen(srchost);
        }
        if(*p == ':') {
          unsigned long port = 0;
          p++;
          if(ISDIGIT(*p))
            /* a port number */
            port = strtoul(p, &end_ptr, 10);
          else
            end_ptr = (char *)p; /* not left uninitialized */
          if(!port || port > USHRT_MAX || end_ptr == p || *end_ptr != '\"') {
            infof(data, "Unknown alt-svc port number, ignoring.");
            valid = FALSE;
          }
          else {
            dstport = curlx_ultous(port);
            p = end_ptr;
          }
        }
        if(*p++ != '\"')
          break;
        /* Handle the optional 'ma' and 'persist' flags. Unknown flags
           are skipped. */
        for(;;) {
          while(ISBLANK(*p))
            p++;
          if(*p != ';')
            break;
          p++; /* pass the semicolon */
          if(!*p || ISNEWLINE(*p))
            break;
          result = getalnum(&p, option, sizeof(option));
          if(result) {
            /* skip option if name is too long */
            option[0] = '\0';
          }
          while(*p && ISBLANK(*p))
            p++;
          if(*p != '=')
            return CURLE_OK;
          p++;
          while(*p && ISBLANK(*p))
            p++;
          if(!*p)
            return CURLE_OK;
          if(*p == '\"') {
            /* quoted value */
            p++;
            quoted = TRUE;
          }
          value_ptr = p;
          if(quoted) {
            while(*p && *p != '\"')
              p++;
            if(!*p++)
              return CURLE_OK;
          }
          else {
            while(*p && !ISBLANK(*p) && *p!= ';' && *p != ',')
              p++;
          }
          num = strtoul(value_ptr, &end_ptr, 10);
          if((end_ptr != value_ptr) && (num < ULONG_MAX)) {
            if(strcasecompare("ma", option))
              maxage = (time_t)num;
            else if(strcasecompare("persist", option) && (num == 1))
              persist = TRUE;
          }
        }
        if(dstalpnid && valid) {
          if(!entries++)
            /* Flush cached alternatives for this source origin, if any - when
               this is the first entry of the line. */
            altsvc_flush(asi, srcalpnid, srchost, srcport);

          as = altsvc_createid(srchost, dsthost, dstlen,
                               srcalpnid, dstalpnid,
                               srcport, dstport);
          if(as) {
            /* The expires time also needs to take the Age: value (if any) into
               account. [See RFC 7838 section 3.1] */
            as->expires = maxage + time(NULL);
            as->persist = persist;
            Curl_llist_append(&asi->list, as, &as->node);
            infof(data, "Added alt-svc: %s:%d over %s", dsthost, dstport,
                  Curl_alpnid2str(dstalpnid));
          }
        }
      }
      else
        break;
      /* after the double quote there can be a comma if there is another
         string or a semicolon if no more */
      if(*p == ',') {
        /* comma means another alternative is presented */
        p++;
        result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
        if(result)
          break;
      }
    }
    else
      break;
  } while(*p && (*p != ';') && (*p != '\n') && (*p != '\r'));

  return CURLE_OK;
}